

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O2

value function_metadata(function_conflict func)

{
  char *__s;
  value v;
  value *ppvVar1;
  value pvVar2;
  size_t length;
  value pvVar3;
  value pvVar4;
  
  v = value_create_array((value *)0x0,2);
  if (v != (value)0x0) {
    ppvVar1 = value_to_array(v);
    pvVar2 = value_create_string("name",4);
    *ppvVar1 = pvVar2;
    if (pvVar2 != (value)0x0) {
      __s = func->name;
      length = strlen(__s);
      pvVar2 = value_create_string(__s,length);
      ppvVar1[1] = pvVar2;
      if ((pvVar2 != (value)0x0) &&
         (pvVar2 = value_create_array((value *)0x0,2), pvVar2 != (value)0x0)) {
        ppvVar1 = value_to_array(pvVar2);
        pvVar3 = value_create_string("signature",9);
        *ppvVar1 = pvVar3;
        if (pvVar3 != (value)0x0) {
          pvVar3 = signature_metadata(func->s);
          ppvVar1[1] = pvVar3;
          if ((pvVar3 != (value)0x0) &&
             (pvVar3 = value_create_array((value *)0x0,2), pvVar3 != (value)0x0)) {
            ppvVar1 = value_to_array(pvVar3);
            pvVar4 = value_create_string("async",5);
            *ppvVar1 = pvVar4;
            if (pvVar4 != (value)0x0) {
              pvVar4 = value_create_bool(func->async != SYNCHRONOUS);
              ppvVar1[1] = pvVar4;
              if ((pvVar4 != (value)0x0) &&
                 (pvVar4 = value_create_map((value *)0x0,3), pvVar4 != (value)0x0)) {
                ppvVar1 = value_to_map(pvVar4);
                *ppvVar1 = v;
                ppvVar1[1] = pvVar2;
                ppvVar1[2] = pvVar3;
                return pvVar4;
              }
            }
            value_type_destroy(pvVar3);
          }
        }
        value_type_destroy(pvVar2);
      }
    }
    value_type_destroy(v);
  }
  return (value)0x0;
}

Assistant:

value function_metadata(function func)
{
	value name, sig, async, f;
	value *f_map;

	/* Create function name array */
	name = function_metadata_name(func);

	if (name == NULL)
	{
		goto error_name;
	}

	/* Create signature array */
	sig = function_metadata_signature(func);

	if (sig == NULL)
	{
		goto error_signature;
	}

	/* Create function async array */
	async = function_metadata_async(func);

	if (async == NULL)
	{
		goto error_async;
	}

	/* Create function map (name + signature + async) */
	f = value_create_map(NULL, 3);

	if (f == NULL)
	{
		goto error_function;
	}

	f_map = value_to_map(f);

	f_map[0] = name;
	f_map[1] = sig;
	f_map[2] = async;

	return f;

error_function:
	value_type_destroy(async);
error_async:
	value_type_destroy(sig);
error_signature:
	value_type_destroy(name);
error_name:
	return NULL;
}